

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath * __thiscall
testing::internal::FilePath::RemoveFileName(FilePath *__return_storage_ptr__,FilePath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  char *pcVar2;
  string dir;
  char *local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  long *local_40 [2];
  long local_30 [2];
  
  __s = (this->pathname_)._M_dataplus._M_p;
  pcVar2 = strrchr(__s,0x2f);
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,0x19cd95);
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,pcVar2 + 1);
    std::__cxx11::string::operator=((string *)&local_60,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
  paVar1 = &(__return_storage_ptr__->pathname_).field_2;
  (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_80 == &local_70) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_6f,local_70);
    *(undefined8 *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = uStack_68;
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = local_80;
    (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity = CONCAT71(uStack_6f,local_70)
    ;
  }
  (__return_storage_ptr__->pathname_)._M_string_length = local_78;
  local_78 = 0;
  local_70 = '\0';
  local_80 = &local_70;
  Normalize(__return_storage_ptr__);
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), static_cast<size_t>(last_sep + 1 - c_str()));
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}